

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::lowerEqZInt64(I64ToI32Lowering *this,Unary *curr)

{
  Builder *pBVar1;
  Expression *pEVar2;
  Binary *this_00;
  Unary *this_01;
  undefined1 local_58 [8];
  TempVar highBits;
  
  fetchOutParam((TempVar *)local_58,this,curr->value);
  if ((char)highBits.pass != '\x01') {
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    highBits.ty.id = (uintptr_t)curr->value;
    pEVar2 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
    pEVar2->_id = LocalGetId;
    pEVar2[1]._id = local_58._0_4_;
    (pEVar2->type).id = 2;
    this_00 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_00->op = OrInt32;
    this_00->left = (Expression *)highBits.ty.id;
    this_00->right = pEVar2;
    Binary::finalize(this_00);
    this_01 = (Unary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x20,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_01->op = EqZInt32;
    this_01->value = (Expression *)this_00;
    Unary::finalize(this_01);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)this_01);
    TempVar::~TempVar((TempVar *)local_58);
    return;
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4c,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerEqZInt64(Unary* curr) {
    TempVar highBits = fetchOutParam(curr->value);

    auto* result = builder->makeUnary(
      EqZInt32,
      builder->makeBinary(
        OrInt32, curr->value, builder->makeLocalGet(highBits, Type::i32)));

    replaceCurrent(result);
  }